

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> * convertToUTF8(vector<char,_std::allocator<char>_> *data)

{
  bool bVar1;
  int iVar2;
  vector<char,_std::allocator<char>_> *in_RSI;
  allocator_type *in_RDI;
  size_t size;
  char *contents;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  int *local_58;
  allocator_type *__last;
  char *in_stack_ffffffffffffffc8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  allocator<char> local_21;
  size_type local_20;
  int *local_18;
  vector<char,_std::allocator<char>_> *size_00;
  allocator_type *data_00;
  
  __last = in_RDI;
  size_00 = in_RSI;
  data_00 = in_RDI;
  bVar1 = std::vector<char,_std::allocator<char>_>::empty(in_stack_ffffffffffffffa0);
  if (bVar1) {
    local_58 = (int *)0x0;
  }
  else {
    local_58 = (int *)std::vector<char,_std::allocator<char>_>::operator[](in_RSI,0);
  }
  local_18 = local_58;
  local_20 = std::vector<char,_std::allocator<char>_>::size(in_RSI);
  if ((local_20 < 4) || (*local_18 != 0xfeff)) {
    if ((local_20 < 4) || (*local_18 != -0x20000)) {
      if ((local_20 < 2) || ((short)*local_18 != -0x101)) {
        if ((local_20 < 2) || ((short)*local_18 != -2)) {
          if ((2 < local_20) && (iVar2 = memcmp(local_18,anon_var_dwarf_26fb8,3), iVar2 == 0)) {
            std::allocator<char>::allocator();
            std::vector<char,std::allocator<char>>::vector<char_const*,void>
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(char *)__last,in_RDI);
            std::allocator<char>::~allocator(&local_21);
            return (vector<char,_std::allocator<char>_> *)__last;
          }
          std::vector<char,_std::allocator<char>_>::vector
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        }
        else {
          convertToUTF8Impl<UTF16Decoder<true>>((char *)data_00,(size_t)size_00);
        }
      }
      else {
        convertToUTF8Impl<UTF16Decoder<false>>((char *)data_00,(size_t)size_00);
      }
    }
    else {
      convertToUTF8Impl<UTF32Decoder<true>>((char *)data_00,(size_t)size_00);
    }
  }
  else {
    convertToUTF8Impl<UTF32Decoder<false>>((char *)data_00,(size_t)size_00);
  }
  return (vector<char,_std::allocator<char>_> *)__last;
}

Assistant:

std::vector<char> convertToUTF8(std::vector<char> data)
{
	const char* contents = data.empty() ? 0 : &data[0];
	size_t size = data.size();

	if (size >= 4 && *reinterpret_cast<const uint32_t*>(contents) == 0x0000feff) return convertToUTF8Impl<UTF32Decoder<false>>(contents + 4, size - 4);
	if (size >= 4 && *reinterpret_cast<const uint32_t*>(contents) == 0xfffe0000) return convertToUTF8Impl<UTF32Decoder<true>>(contents + 4, size - 4);
	if (size >= 2 && *reinterpret_cast<const uint16_t*>(contents) == 0xfeff) return convertToUTF8Impl<UTF16Decoder<false>>(contents + 2, size - 2);
	if (size >= 2 && *reinterpret_cast<const uint16_t*>(contents) == 0xfffe) return convertToUTF8Impl<UTF16Decoder<true>>(contents + 2, size - 2);
	if (size >= 3 && memcmp(contents, "\xef\xbb\xbf", 3) == 0) return std::vector<char>(contents + 3, contents + size);

	return data;
}